

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O0

double __thiscall
Alg::opim_approx_fast
          (Alg *this,Graph *graph,double budget,vector<double,_std::allocator<double>_> *budget_list
          ,double epsilon,double feps,double delta,string *model,string *graphname,int mode)

{
  code *pcVar1;
  ostream *poVar2;
  size_t sVar3;
  size_type sVar4;
  reference pvVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int local_54c;
  int local_548;
  int i_8;
  int i_7;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  char *local_468;
  char *dt;
  time_t now;
  double local_450;
  double local_448;
  double local_440;
  double approxOPIMC;
  double upperOPT;
  double lowerSelect;
  double upperDegOPT;
  double upperBound;
  double degVldt;
  double infVldt;
  double infSelf;
  int numR;
  ulong local_3f0;
  size_t idx;
  vector<double,_std::allocator<double>_> time_f;
  vector<double,_std::allocator<double>_> time_b;
  vector<double,_std::allocator<double>_> time_n;
  vector<double,_std::allocator<double>_> approx_f;
  vector<double,_std::allocator<double>_> approx_b;
  vector<double,_std::allocator<double>_> approx_n;
  vector<double,_std::allocator<double>_> inf_f;
  vector<double,_std::allocator<double>_> inf_b;
  vector<double,_std::allocator<double>_> inf_n;
  double time_rr;
  double timeb_ft;
  double time2_ft;
  double time1_ft;
  double timeb_fs;
  double time2_fs;
  double time1_fs;
  double timeb_f;
  double time2_f;
  double time1_f;
  double timeb_b;
  double time2_b;
  double time1_b;
  double timeb_n;
  double time2_n;
  double time1_n;
  double a2;
  double a1;
  int theta_0;
  int numIter;
  ofstream outfile;
  undefined1 local_78 [8];
  Timer timerOPIMC;
  int mode_local;
  string *graphname_local;
  string *model_local;
  double delta_local;
  double feps_local;
  double epsilon_local;
  vector<double,_std::allocator<double>_> *budget_list_local;
  double budget_local;
  Graph *graph_local;
  Alg *this_local;
  
  timerOPIMC.__processName._4_4_ = mode;
  Timer::Timer((Timer *)local_78,"OPIM-APPORX");
  std::ofstream::ofstream(&theta_0);
  a1._4_4_ = 0xc;
  a1._0_4_ = 1000;
  a2 = log(36.0 / delta);
  time1_n = log(36.0 / delta);
  time2_n = 0.0;
  timeb_n = 0.0;
  time1_b = 0.0;
  time2_b = 0.0;
  timeb_b = 0.0;
  time1_f = 0.0;
  time2_f = 0.0;
  timeb_f = 0.0;
  time1_fs = 0.0;
  inf_n.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &inf_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &inf_f.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &approx_n.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &approx_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &approx_f.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &time_n.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &time_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &time_f.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&idx);
  local_3f0 = 0;
  do {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_3f0);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    infSelf._0_4_ = 1000 << ((byte)local_3f0 & 0x1f);
    Timer::get_operation_time((Timer *)local_78);
    HyperGraph::build_n_RRsets(&this->__hyperG,(long)infSelf._0_4_);
    HyperGraph::build_n_RRsets(&this->__hyperGVldt,(long)infSelf._0_4_);
    poVar2 = std::operator<<((ostream *)&std::cout,"# RR sets: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,infSelf._0_4_);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    sVar3 = HyperGraph::get_RR_sets_size(&this->__hyperG);
    this->__numRRsets = sVar3;
    dVar6 = Timer::get_operation_time((Timer *)local_78);
    inf_n.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)((double)inf_n.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + dVar6);
    infVldt = max_cover_budget_fast_end
                        (this,graph,budget,budget_list,0.01,&time1_b,timerOPIMC.__processName._4_4_)
    ;
    dVar6 = Timer::get_operation_time((Timer *)local_78);
    timeb_n = timeb_n + dVar6;
    degVldt = HyperGraph::self_inf_cal(&this->__hyperGVldt,&this->__vecSeed);
    sVar3 = this->__numRRsets;
    auVar8._8_4_ = (int)(sVar3 >> 0x20);
    auVar8._0_8_ = sVar3;
    auVar8._12_4_ = 0x45300000;
    upperBound = (degVldt *
                 ((auVar8._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0))) /
                 (double)this->__numV;
    upperDegOPT = infVldt;
    if (timerOPIMC.__processName._4_4_ == 1) {
      upperDegOPT = max_element(this->__boundLast_inf,this->__boundLast_inf_cost);
    }
    else if (timerOPIMC.__processName._4_4_ == 2) {
      if ((this->__is_inf_cost & 1U) == 0) {
        upperDegOPT = this->__boundMin_inf;
      }
      else {
        upperDegOPT = this->__boundMin_inf_cost;
      }
    }
    sVar3 = this->__numRRsets;
    auVar9._8_4_ = (int)(sVar3 >> 0x20);
    auVar9._0_8_ = sVar3;
    auVar9._12_4_ = 0x45300000;
    lowerSelect = (upperDegOPT *
                  ((auVar9._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0))) /
                  (double)this->__numV;
    dVar6 = sqrt(upperBound + (a2 + a2) / 9.0);
    dVar7 = sqrt(a2 * 0.5);
    dVar6 = pow2(dVar6 - dVar7);
    upperOPT = dVar6 - a2 / 18.0;
    if (upperOPT < 0.0) {
      upperOPT = 0.0;
    }
    dVar6 = sqrt(lowerSelect + time1_n * 0.5);
    dVar7 = sqrt(time1_n * 0.5);
    approxOPIMC = pow2(dVar6 + dVar7);
    local_440 = upperOPT / approxOPIMC;
    poVar2 = std::operator<<((ostream *)&std::cout," -->OPIM-APPROX-F-0.01 (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_3f0 + 1);
    poVar2 = std::operator<<(poVar2,"/");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xc);
    poVar2 = std::operator<<(poVar2,") approx. (max-cover): ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_440);
    poVar2 = std::operator<<(poVar2," (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,infVldt / upperDegOPT);
    poVar2 = std::operator<<(poVar2,"), #RR sets: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->__numRRsets);
    std::operator<<(poVar2,'\n');
    poVar2 = std::operator<<((ostream *)&std::cout,"==>Influence via R2: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,degVldt);
    poVar2 = std::operator<<(poVar2,", time: ");
    dVar6 = ResultInfo::get_running_time(this->__tRes);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar6);
    std::operator<<(poVar2,'\n');
    poVar2 = std::operator<<((ostream *)&std::cout,"==>Time for RR sets and greedy: ");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,(double)inf_n.super__Vector_base<double,_std::allocator<double>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,timeb_n + (double)inf_n.
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
    ;
    std::operator<<(poVar2,'\n');
    poVar2 = std::operator<<((ostream *)&std::cout,"==>Time for Bound Computation: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,time1_b);
    std::operator<<(poVar2,'\n');
    poVar2 = std::operator<<((ostream *)&std::cout,"Seed size: ");
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->__vecSeed);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar4);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               &approx_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_440);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               &inf_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&degVldt);
    local_448 = timeb_n + (double)inf_n.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               &time_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_448);
    dVar6 = Timer::get_operation_time((Timer *)local_78);
    time2_b = time2_b + dVar6;
    infVldt = max_cover_budget_fast_end
                        (this,graph,budget,budget_list,0.05,&time1_f,timerOPIMC.__processName._4_4_)
    ;
    dVar6 = Timer::get_operation_time((Timer *)local_78);
    timeb_b = timeb_b + dVar6;
    degVldt = HyperGraph::self_inf_cal(&this->__hyperGVldt,&this->__vecSeed);
    sVar3 = this->__numRRsets;
    auVar10._8_4_ = (int)(sVar3 >> 0x20);
    auVar10._0_8_ = sVar3;
    auVar10._12_4_ = 0x45300000;
    upperBound = (degVldt *
                 ((auVar10._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0))) /
                 (double)this->__numV;
    upperDegOPT = infVldt;
    if (timerOPIMC.__processName._4_4_ == 1) {
      upperDegOPT = max_element(this->__boundLast_inf,this->__boundLast_inf_cost);
    }
    else if (timerOPIMC.__processName._4_4_ == 2) {
      if ((this->__is_inf_cost & 1U) == 0) {
        upperDegOPT = this->__boundMin_inf;
      }
      else {
        upperDegOPT = this->__boundMin_inf_cost;
      }
    }
    sVar3 = this->__numRRsets;
    auVar11._8_4_ = (int)(sVar3 >> 0x20);
    auVar11._0_8_ = sVar3;
    auVar11._12_4_ = 0x45300000;
    lowerSelect = (upperDegOPT *
                  ((auVar11._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0))) /
                  (double)this->__numV;
    dVar6 = sqrt(upperBound + (a2 + a2) / 9.0);
    dVar7 = sqrt(a2 * 0.5);
    dVar6 = pow2(dVar6 - dVar7);
    upperOPT = dVar6 - a2 / 18.0;
    if (upperOPT < 0.0) {
      upperOPT = 0.0;
    }
    dVar6 = sqrt(lowerSelect + time1_n * 0.5);
    dVar7 = sqrt(time1_n * 0.5);
    approxOPIMC = pow2(dVar6 + dVar7);
    local_440 = upperOPT / approxOPIMC;
    poVar2 = std::operator<<((ostream *)&std::cout," -->OPIM-APPROX-F-0.05 (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_3f0 + 1);
    poVar2 = std::operator<<(poVar2,"/");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xc);
    poVar2 = std::operator<<(poVar2,") approx. (max-cover): ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_440);
    poVar2 = std::operator<<(poVar2," (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,infVldt / upperDegOPT);
    poVar2 = std::operator<<(poVar2,"), #RR sets: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->__numRRsets);
    std::operator<<(poVar2,'\n');
    poVar2 = std::operator<<((ostream *)&std::cout,"==>Influence via R2: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,degVldt);
    poVar2 = std::operator<<(poVar2,", time: ");
    dVar6 = ResultInfo::get_running_time(this->__tRes);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar6);
    std::operator<<(poVar2,'\n');
    poVar2 = std::operator<<((ostream *)&std::cout,"==>Time for RR sets and greedy: ");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,(double)inf_n.super__Vector_base<double,_std::allocator<double>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,timeb_b + (double)inf_n.
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
    ;
    std::operator<<(poVar2,'\n');
    poVar2 = std::operator<<((ostream *)&std::cout,"==>Time for Bound Computation: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,time1_f);
    std::operator<<(poVar2,'\n');
    poVar2 = std::operator<<((ostream *)&std::cout,"Seed size: ");
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->__vecSeed);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar4);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               &approx_f.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_440);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               &inf_f.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&degVldt);
    local_450 = timeb_b + (double)inf_n.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               &time_f.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_450);
    dVar6 = Timer::get_operation_time((Timer *)local_78);
    time2_f = time2_f + dVar6;
    infVldt = max_cover_budget_fast_end
                        (this,graph,budget,budget_list,0.1,&time1_fs,timerOPIMC.__processName._4_4_)
    ;
    dVar6 = Timer::get_operation_time((Timer *)local_78);
    timeb_f = timeb_f + dVar6;
    degVldt = HyperGraph::self_inf_cal(&this->__hyperGVldt,&this->__vecSeed);
    sVar3 = this->__numRRsets;
    auVar12._8_4_ = (int)(sVar3 >> 0x20);
    auVar12._0_8_ = sVar3;
    auVar12._12_4_ = 0x45300000;
    upperBound = (degVldt *
                 ((auVar12._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0))) /
                 (double)this->__numV;
    upperDegOPT = infVldt;
    if (timerOPIMC.__processName._4_4_ == 1) {
      upperDegOPT = max_element(this->__boundLast_inf,this->__boundLast_inf_cost);
    }
    else if (timerOPIMC.__processName._4_4_ == 2) {
      if ((this->__is_inf_cost & 1U) == 0) {
        upperDegOPT = this->__boundMin_inf;
      }
      else {
        upperDegOPT = this->__boundMin_inf_cost;
      }
    }
    sVar3 = this->__numRRsets;
    auVar13._8_4_ = (int)(sVar3 >> 0x20);
    auVar13._0_8_ = sVar3;
    auVar13._12_4_ = 0x45300000;
    lowerSelect = (upperDegOPT *
                  ((auVar13._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0))) /
                  (double)this->__numV;
    dVar6 = sqrt(upperBound + (a2 + a2) / 9.0);
    dVar7 = sqrt(a2 * 0.5);
    dVar6 = pow2(dVar6 - dVar7);
    upperOPT = dVar6 - a2 / 18.0;
    if (upperOPT < 0.0) {
      upperOPT = 0.0;
    }
    dVar6 = sqrt(lowerSelect + time1_n * 0.5);
    dVar7 = sqrt(time1_n * 0.5);
    approxOPIMC = pow2(dVar6 + dVar7);
    local_440 = upperOPT / approxOPIMC;
    poVar2 = std::operator<<((ostream *)&std::cout," -->OPIM-APPROX-F-0.1 (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_3f0 + 1);
    poVar2 = std::operator<<(poVar2,"/");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xc);
    poVar2 = std::operator<<(poVar2,") approx. (max-cover): ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_440);
    poVar2 = std::operator<<(poVar2," (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,infVldt / upperDegOPT);
    poVar2 = std::operator<<(poVar2,"), #RR sets: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->__numRRsets);
    std::operator<<(poVar2,'\n');
    poVar2 = std::operator<<((ostream *)&std::cout,"==>Influence via R2: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,degVldt);
    poVar2 = std::operator<<(poVar2,", time: ");
    dVar6 = ResultInfo::get_running_time(this->__tRes);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar6);
    std::operator<<(poVar2,'\n');
    poVar2 = std::operator<<((ostream *)&std::cout,"==>Time for RR sets and greedy: ");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,(double)inf_n.super__Vector_base<double,_std::allocator<double>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,timeb_f + (double)inf_n.
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
    ;
    std::operator<<(poVar2,'\n');
    poVar2 = std::operator<<((ostream *)&std::cout,"==>Time for Bound Computation: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,time1_fs);
    std::operator<<(poVar2,'\n');
    poVar2 = std::operator<<((ostream *)&std::cout,"Seed size: ");
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->__vecSeed);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar4);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               &time_n.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_440);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               &approx_n.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&degVldt);
    now = (time_t)(timeb_f +
                  (double)inf_n.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)&idx,(value_type_conflict4 *)&now);
    local_3f0 = local_3f0 + 1;
  } while (local_3f0 != 0xc);
  dt = (char *)time((time_t *)0x0);
  local_468 = ctime((time_t *)&dt);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_1,"xi/",
                 model);
  std::operator+(&local_508,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_1,"_");
  std::operator+(&local_4e8,&local_508,graphname);
  std::operator+(&local_4c8,&local_4e8,"_");
  std::operator+(&local_4a8,&local_4c8,local_468);
  std::operator+(&local_488,&local_4a8,".txt");
  std::ofstream::open((string *)&theta_0,(_Ios_Openmode)&local_488);
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&i_1);
  for (i_2 = 0; sVar4 = std::vector<double,_std::allocator<double>_>::size
                                  ((vector<double,_std::allocator<double>_> *)
                                   &approx_b.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage),
      (ulong)(long)i_2 < sVar4; i_2 = i_2 + 1) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &approx_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)i_2);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&theta_0,*pvVar5);
    std::operator<<(poVar2,",");
  }
  std::ostream::operator<<((ostream *)&theta_0,std::endl<char,std::char_traits<char>>);
  for (i_3 = 0; sVar4 = std::vector<double,_std::allocator<double>_>::size
                                  ((vector<double,_std::allocator<double>_> *)
                                   &time_b.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage),
      (ulong)(long)i_3 < sVar4; i_3 = i_3 + 1) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &time_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)i_3);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&theta_0,*pvVar5);
    std::operator<<(poVar2,",");
  }
  std::ostream::operator<<((ostream *)&theta_0,std::endl<char,std::char_traits<char>>);
  for (i_4 = 0; sVar4 = std::vector<double,_std::allocator<double>_>::size
                                  ((vector<double,_std::allocator<double>_> *)
                                   &inf_b.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage),
      (ulong)(long)i_4 < sVar4; i_4 = i_4 + 1) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &inf_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)i_4);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&theta_0,*pvVar5);
    std::operator<<(poVar2,",");
  }
  std::ostream::operator<<((ostream *)&theta_0,std::endl<char,std::char_traits<char>>);
  for (i_5 = 0; sVar4 = std::vector<double,_std::allocator<double>_>::size
                                  ((vector<double,_std::allocator<double>_> *)
                                   &approx_f.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage),
      (ulong)(long)i_5 < sVar4; i_5 = i_5 + 1) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &approx_f.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)i_5);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&theta_0,*pvVar5);
    std::operator<<(poVar2,",");
  }
  std::ostream::operator<<((ostream *)&theta_0,std::endl<char,std::char_traits<char>>);
  for (i_6 = 0; sVar4 = std::vector<double,_std::allocator<double>_>::size
                                  ((vector<double,_std::allocator<double>_> *)
                                   &time_f.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage),
      (ulong)(long)i_6 < sVar4; i_6 = i_6 + 1) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &time_f.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)i_6);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&theta_0,*pvVar5);
    std::operator<<(poVar2,",");
  }
  std::ostream::operator<<((ostream *)&theta_0,std::endl<char,std::char_traits<char>>);
  for (i_7 = 0; sVar4 = std::vector<double,_std::allocator<double>_>::size
                                  ((vector<double,_std::allocator<double>_> *)
                                   &inf_f.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage),
      (ulong)(long)i_7 < sVar4; i_7 = i_7 + 1) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &inf_f.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)i_7);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&theta_0,*pvVar5);
    std::operator<<(poVar2,",");
  }
  std::ostream::operator<<((ostream *)&theta_0,std::endl<char,std::char_traits<char>>);
  for (i_8 = 0; sVar4 = std::vector<double,_std::allocator<double>_>::size
                                  ((vector<double,_std::allocator<double>_> *)
                                   &time_n.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage),
      (ulong)(long)i_8 < sVar4; i_8 = i_8 + 1) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &time_n.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)i_8);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&theta_0,*pvVar5);
    std::operator<<(poVar2,",");
  }
  std::ostream::operator<<((ostream *)&theta_0,std::endl<char,std::char_traits<char>>);
  for (local_548 = 0;
      sVar4 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)&idx),
      (ulong)(long)local_548 < sVar4; local_548 = local_548 + 1) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&idx,(long)local_548);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&theta_0,*pvVar5);
    std::operator<<(poVar2,",");
  }
  std::ostream::operator<<((ostream *)&theta_0,std::endl<char,std::char_traits<char>>);
  for (local_54c = 0;
      sVar4 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)
                         &approx_n.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage), (ulong)(long)local_54c < sVar4
      ; local_54c = local_54c + 1) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &approx_n.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)local_54c);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&theta_0,*pvVar5);
    std::operator<<(poVar2,",");
  }
  std::ostream::operator<<((ostream *)&theta_0,std::endl<char,std::char_traits<char>>);
  std::ofstream::close();
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

double Alg::opim_approx_fast(const Graph & graph, const double budget, const std::vector<double> & budget_list,
        const double epsilon, const double feps, const double delta, const std::string model,
        const std::string graphname, const int mode) {
    Timer timerOPIMC("OPIM-APPORX");
    std::ofstream outfile;
    const auto numIter = 12;
    const auto theta_0 = 1000;
    const double a1 = log(numIter * 3.0 / delta);
    const double a2 = log(numIter * 3.0 / delta);
    double time1_n = 0.0, time2_n = 0.0;
    double timeb_n = 0.0;
    double time1_b = 0.0, time2_b = 0.0;
    double timeb_b = 0.0;
    double time1_f = 0.0, time2_f = 0.0;
    double timeb_f = 0.0;
    double time1_fs = 0.0, time2_fs = 0.0;
    double timeb_fs = 0.0;
    double time1_ft = 0.0, time2_ft = 0.0;
    double timeb_ft = 0.0;
    double time_rr = 0.0;
    std::vector<double> inf_n, inf_b, inf_f;
    std::vector<double> approx_n, approx_b, approx_f;
    std::vector<double> time_n, time_b, time_f;
    size_t idx = 0;
    while (true) {
        std::cout << idx << std::endl;
        const auto numR = theta_0 << idx;
        timerOPIMC.get_operation_time();
        __hyperG.build_n_RRsets(numR); // R1
        __hyperGVldt.build_n_RRsets(numR); // R2
        std::cout << "# RR sets: " << numR << std::endl;
        __numRRsets = __hyperG.get_RR_sets_size();
        /// OPIM-B-F 0.01
        time_rr += timerOPIMC.get_operation_time();
        auto infSelf = max_cover_budget_fast_end(graph, budget, budget_list, 0.01, timeb_n, mode);
        time2_n += timerOPIMC.get_operation_time();
        auto infVldt = __hyperGVldt.self_inf_cal(__vecSeed);
        auto degVldt = infVldt * __numRRsets / __numV;
        auto upperBound = infSelf;
        if (mode == 1) {
            upperBound = max_element(__boundLast_inf, __boundLast_inf_cost);
        }
        else if (mode == 2) {
            if (__is_inf_cost) {
                upperBound = __boundMin_inf_cost;
            }
            else {
                upperBound = __boundMin_inf;
            }
        }
        auto upperDegOPT = upperBound * __numRRsets / __numV;
        auto lowerSelect = pow2(sqrt(degVldt + a1 * 2.0 / 9.0) - sqrt(a1 / 2.0)) - a1 / 18.0;
        if (lowerSelect < 0) {
            lowerSelect = 0;
        }
        auto upperOPT = pow2(sqrt(upperDegOPT + a2 / 2.0) + sqrt(a2 / 2.0));
        auto approxOPIMC = lowerSelect / upperOPT;
        std::cout << " -->OPIM-APPROX-F-0.01 (" << idx + 1 << "/" << numIter << ") approx. (max-cover): " <<
                  approxOPIMC << " (" << infSelf / upperBound << "), #RR sets: " << __numRRsets << '\n';
        std::cout << "==>Influence via R2: " << infVldt << ", time: " << __tRes.get_running_time() << '\n';
        std::cout << "==>Time for RR sets and greedy: " << time_rr << ", " << time2_n + time_rr << '\n';
        std::cout << "==>Time for Bound Computation: " << timeb_n << '\n';
        std::cout << "Seed size: " << __vecSeed.size() << std::endl;
        approx_n.push_back(approxOPIMC);
        inf_n.push_back(infVldt);
        time_n.push_back(time2_n + time_rr);

        /// OPIM-B-F 0.05
        time1_b += timerOPIMC.get_operation_time();
        infSelf = max_cover_budget_fast_end(graph, budget, budget_list, 0.05, timeb_b, mode);
        time2_b += timerOPIMC.get_operation_time();
        infVldt = __hyperGVldt.self_inf_cal(__vecSeed);
        degVldt = infVldt * __numRRsets / __numV;
        upperBound = infSelf;
        if (mode == 1) {
            upperBound = max_element(__boundLast_inf, __boundLast_inf_cost);
        }
        else if (mode == 2) {
            if (__is_inf_cost) {
                upperBound = __boundMin_inf_cost;
            }
            else {
                upperBound = __boundMin_inf;
            }
        }
        upperDegOPT = upperBound * __numRRsets / __numV;
        lowerSelect = pow2(sqrt(degVldt + a1 * 2.0 / 9.0) - sqrt(a1 / 2.0)) - a1 / 18.0;
        if (lowerSelect < 0) {
            lowerSelect = 0;
        }
        upperOPT = pow2(sqrt(upperDegOPT + a2 / 2.0) + sqrt(a2 / 2.0));
        approxOPIMC = lowerSelect / upperOPT;
        std::cout << " -->OPIM-APPROX-F-0.05 (" << idx + 1 << "/" << numIter << ") approx. (max-cover): " <<
                  approxOPIMC << " (" << infSelf / upperBound << "), #RR sets: " << __numRRsets << '\n';
        std::cout << "==>Influence via R2: " << infVldt << ", time: " << __tRes.get_running_time() << '\n';
        std::cout << "==>Time for RR sets and greedy: " << time_rr << ", " << time2_b + time_rr << '\n';
        std::cout << "==>Time for Bound Computation: " << timeb_b << '\n';
        std::cout << "Seed size: " << __vecSeed.size() << std::endl;
        approx_b.push_back(approxOPIMC);
        inf_b.push_back(infVldt);
        time_b.push_back(time2_b + time_rr);

        /// OPIM-B-F 0.1
        time1_f += timerOPIMC.get_operation_time();
        infSelf = max_cover_budget_fast_end(graph, budget, budget_list, 0.1, timeb_f, mode);
        time2_f += timerOPIMC.get_operation_time();
        infVldt = __hyperGVldt.self_inf_cal(__vecSeed);
        degVldt = infVldt * __numRRsets / __numV;
        upperBound = infSelf;
        if (mode == 1) {
            upperBound = max_element(__boundLast_inf, __boundLast_inf_cost);
        }
        else if (mode == 2) {
            if (__is_inf_cost) {
                upperBound = __boundMin_inf_cost;
            }
            else {
                upperBound = __boundMin_inf;
            }
        }
        upperDegOPT = upperBound * __numRRsets / __numV;
        lowerSelect = pow2(sqrt(degVldt + a1 * 2.0 / 9.0) - sqrt(a1 / 2.0)) - a1 / 18.0;
        if (lowerSelect < 0) {
            lowerSelect = 0;
        }
        upperOPT = pow2(sqrt(upperDegOPT + a2 / 2.0) + sqrt(a2 / 2.0));
        approxOPIMC = lowerSelect / upperOPT;
        std::cout << " -->OPIM-APPROX-F-0.1 (" << idx + 1 << "/" << numIter << ") approx. (max-cover): " <<
                  approxOPIMC << " (" << infSelf / upperBound << "), #RR sets: " << __numRRsets << '\n';
        std::cout << "==>Influence via R2: " << infVldt << ", time: " << __tRes.get_running_time() << '\n';
        std::cout << "==>Time for RR sets and greedy: " << time_rr << ", " << time2_f + time_rr << '\n';
        std::cout << "==>Time for Bound Computation: " << timeb_f << '\n';
        std::cout << "Seed size: " << __vecSeed.size() << std::endl;
        approx_f.push_back(approxOPIMC);
        inf_f.push_back(infVldt);
        time_f.push_back(time2_f + time_rr);
        idx = idx + 1;
        if (idx == numIter) {
            break;
        }
    }
    time_t now = time(0);
    char* dt = ctime(&now);
    outfile.open("xi/" + model + "_" + graphname + "_" + dt + ".txt");
    for(int i = 0; i < approx_n.size(); i++) {
        outfile << approx_n[i] << ",";
    }
    outfile << std::endl;
    for(int i = 0; i < time_n.size(); i++) {
        outfile << time_n[i] << ",";
    }
    outfile << std::endl;
    for(int i = 0; i < inf_n.size(); i++) {
        outfile << inf_n[i] << ",";
    }
    outfile << std::endl;
    for(int i = 0; i < approx_b.size(); i++) {
        outfile << approx_b[i] << ",";
    }
    outfile << std::endl;
    for(int i = 0; i < time_b.size(); i++) {
        outfile << time_b[i] << ",";
    }
    outfile << std::endl;
    for(int i = 0; i < inf_b.size(); i++) {
        outfile << inf_b[i] << ",";
    }
    outfile << std::endl;
    for(int i = 0; i < approx_f.size(); i++) {
        outfile << approx_f[i] << ",";
    }
    outfile << std::endl;
    for(int i = 0; i < time_f.size(); i++) {
        outfile << time_f[i] << ",";
    }
    outfile << std::endl;
    for(int i = 0; i < inf_f.size(); i++) {
        outfile << inf_f[i] << ",";
    }
    outfile << std::endl;
    outfile.close();
}